

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O3

optional<QDBusListener::ChangeSignal> __thiscall
QDBusListener::findSignal(QDBusListener *this,QString *location,QString *key)

{
  ChangeSignal CVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined8 unaff_RBP;
  ulong uVar4;
  long in_FS_OFFSET;
  const_iterator cVar5;
  optional<QDBusListener::ChangeSignal> oVar6;
  DBusKey local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.location.d.d = (location->d).d;
  local_50.location.d.ptr = (location->d).ptr;
  local_50.location.d.size = (location->d).size;
  if (&(local_50.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_50.location.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_50.location.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.key.d.d = (key->d).d;
  local_50.key.d.ptr = (key->d).ptr;
  local_50.key.d.size = (key->d).size;
  if (&(local_50.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_50.key.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_50.key.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  cVar5 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
          ::find(&this->m_signalMap,&local_50);
  if ((cVar5.c == &(this->m_signalMap).c) && (cVar5.i == (this->m_signalMap).c.keys.d.size)) {
    uVar3 = 0;
    uVar2 = 0xaaaaaaaa00000000;
    uVar4 = 0xaaaaaaaa;
  }
  else {
    CVar1 = ((cVar5.c)->values).d.ptr[cVar5.i];
    uVar2 = (ulong)CVar1 & 0xffffffff00000000;
    uVar4 = (ulong)CVar1 & 0xffffffff;
    uVar3 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  if (&(local_50.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.key.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_50.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_50.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_50.location.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    oVar6.super__Optional_base<QDBusListener::ChangeSignal,_true,_true>._M_payload.
    super__Optional_payload_base<QDBusListener::ChangeSignal>._8_4_ = uVar3;
    oVar6.super__Optional_base<QDBusListener::ChangeSignal,_true,_true>._M_payload.
    super__Optional_payload_base<QDBusListener::ChangeSignal>._M_payload =
         (_Storage<QDBusListener::ChangeSignal,_true>)(uVar2 | uVar4);
    return (optional<QDBusListener::ChangeSignal>)
           oVar6.super__Optional_base<QDBusListener::ChangeSignal,_true,_true>._M_payload.
           super__Optional_payload_base<QDBusListener::ChangeSignal>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<QDBusListener::ChangeSignal>
    QDBusListener::findSignal(const QString &location, const QString &key) const
{
    const DBusKey dkey(location, key);
    std::optional<QDBusListener::ChangeSignal> ret;
    const auto it = m_signalMap.find(dkey);
    if (it != m_signalMap.cend())
        ret.emplace(it.value());

    return ret;
}